

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O2

void convert<signed_char,unsigned_char>(vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uchar uVar4;
  uint uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  key_type local_70;
  size_type local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar5 = (int)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
          (int)(src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
  sVar9 = (size_type)(int)uVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,sVar9,
             (allocator_type *)&local_70);
  uVar8 = 0;
  uVar7 = 0;
  local_68 = sVar9;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  for (; sVar9 = local_68, uVar7 != uVar8; uVar8 = uVar8 + 1) {
    uVar4 = (src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    local_70._M_target = (type_info *)&signed_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_70);
    fVar1 = *pmVar6;
    local_50._M_target = (type_info *)&signed_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_50);
    fVar2 = *pmVar6;
    local_58._M_target = (type_info *)&unsigned_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleScale,&local_58);
    fVar3 = *pmVar6;
    local_60._M_target = (type_info *)&unsigned_char::typeinfo;
    pmVar6 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at(&kSampleOffset,&local_60);
    local_48._M_impl.super__Vector_impl_data._M_start[uVar8] =
         (uchar)(int)((((float)(int)(char)uVar4 - fVar1) / fVar2) * fVar3 + *pmVar6);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(src,local_68);
  memcpy((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,local_48._M_impl.super__Vector_impl_data._M_start,sVar9);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}